

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

wchar_t assertion_text_file_contents(char *filename,wchar_t line,char *buff,char *fn)

{
  char cVar1;
  int iVar2;
  FILE *__stream;
  size_t sVar3;
  char *p;
  char *pcVar4;
  char *pcVar5;
  char cVar6;
  uint uVar7;
  long lVar8;
  wchar_t wVar9;
  
  assertions = assertions + L'\x01';
  msg = nextmsg;
  nextmsg = (char *)0x0;
  __stream = fopen(fn,"r");
  if (__stream == (FILE *)0x0) {
    wVar9 = L'\0';
    failure_start(filename,line,"File doesn\'t exist: %s",fn);
    failure_finish(filename);
  }
  else {
    sVar3 = strlen(buff);
    iVar2 = (int)sVar3;
    p = (char *)malloc((long)(iVar2 * 2 + 0x80));
    sVar3 = fread(p,1,(long)(iVar2 * 2 + 0x7f),__stream);
    uVar7 = (uint)sVar3;
    if (-1 < (int)uVar7) {
      p[uVar7 & 0x7fffffff] = '\0';
    }
    fclose(__stream);
    cVar6 = *buff;
    pcVar4 = p;
    if (cVar6 != '\0') {
      pcVar5 = buff + 1;
      do {
        cVar1 = *pcVar4;
        if ((cVar1 == '\0') ||
           ((lVar8 = 1, cVar6 != cVar1 &&
            (((cVar6 != '\n' || (cVar1 != '\r')) || (lVar8 = 2, pcVar4[1] != '\n'))))))
        goto LAB_00104e25;
        pcVar4 = pcVar4 + lVar8;
        cVar6 = *pcVar5;
        pcVar5 = pcVar5 + 1;
      } while (cVar6 != '\0');
    }
    if (*pcVar4 == '\0') {
      free(p);
      wVar9 = L'\x01';
    }
    else {
LAB_00104e25:
      failure_start(filename,line,"Contents don\'t match");
      logprintf("  file=\"%s\"\n",fn);
      if ((int)uVar7 < 1) {
        pcVar4 = (char *)0x0;
        logprintf("  File empty, contents should be:\n");
      }
      else {
        hexdump(p,buff,(ulong)(uVar7 & 0x7fffffff),0);
        logprintf("  expected\n",fn);
        pcVar4 = p;
      }
      wVar9 = L'\0';
      hexdump(buff,pcVar4,(long)iVar2,0);
      failure_finish(buff);
      free(p);
    }
  }
  return wVar9;
}

Assistant:

int
assertion_text_file_contents(const char *filename, int line, const char *buff, const char *fn)
{
	char *contents;
	const char *btxt, *ftxt;
	FILE *f;
	int n, s;

	assertion_count(filename, line);
	f = fopen(fn, "r");
	if (f == NULL) {
		failure_start(filename, line,
		    "File doesn't exist: %s", fn);
		failure_finish(NULL);
		return (0);
	}
	s = (int)strlen(buff);
	contents = malloc(s * 2 + 128);
	n = (int)fread(contents, 1, s * 2 + 128 - 1, f);
	if (n >= 0)
		contents[n] = '\0';
	fclose(f);
	/* Compare texts. */
	btxt = buff;
	ftxt = (const char *)contents;
	while (*btxt != '\0' && *ftxt != '\0') {
		if (*btxt == *ftxt) {
			++btxt;
			++ftxt;
			continue;
		}
		if (btxt[0] == '\n' && ftxt[0] == '\r' && ftxt[1] == '\n') {
			/* Pass over different new line characters. */
			++btxt;
			ftxt += 2;
			continue;
		}
		break;
	}
	if (*btxt == '\0' && *ftxt == '\0') {
		free(contents);
		return (1);
	}
	failure_start(filename, line, "Contents don't match");
	logprintf("  file=\"%s\"\n", fn);
	if (n > 0) {
		hexdump(contents, buff, n, 0);
		logprintf("  expected\n", fn);
		hexdump(buff, contents, s, 0);
	} else {
		logprintf("  File empty, contents should be:\n");
		hexdump(buff, NULL, s, 0);
	}
	failure_finish(NULL);
	free(contents);
	return (0);
}